

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O0

Entity * QXmlStreamReaderPrivate::Entity::createLiteral
                   (QLatin1StringView name,QLatin1StringView value)

{
  long lVar1;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  char *in_RCX;
  Entity *in_RDI;
  long in_FS_OFFSET;
  Entity *result;
  QString *in_stack_ffffffffffffff40;
  Entity *this;
  Entity *pEVar2;
  char *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->field_0x30 = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->value).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->value).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->name).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->value).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->name).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = in_stack_ffffffffffffff78;
  latin1.m_size = (qsizetype)in_RDI;
  this = in_RDI;
  pEVar2 = in_RDI;
  QString::QString(&in_RDI->name,latin1);
  latin1_00.m_data = in_RCX;
  latin1_00.m_size = (qsizetype)pEVar2;
  QString::QString(&this->name,latin1_00);
  Entity(this,&in_RDI->name,in_stack_ffffffffffffff40);
  QString::~QString((QString *)0x65743d);
  QString::~QString((QString *)0x65744a);
  in_RDI->field_0x30 = in_RDI->field_0x30 & 0xf7 | 8;
  in_RDI->field_0x30 = in_RDI->field_0x30 & 0xfb | 4;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

static inline Entity createLiteral(QLatin1StringView name, QLatin1StringView value)
            { Entity result(name, value); result.literal = result.hasBeenParsed = true; return result; }